

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int emit_indname_block(nghttp2_bufs *bufs,size_t idx,nghttp2_nv *nv,int indexing_mode)

{
  size_t len;
  size_t local_60;
  size_t prefixlen;
  uint8_t sb [16];
  size_t blocklen;
  uint8_t *bufp;
  int rv;
  int indexing_mode_local;
  nghttp2_nv *nv_local;
  size_t idx_local;
  nghttp2_bufs *bufs_local;
  
  if (indexing_mode == 0) {
    local_60 = 6;
  }
  else {
    local_60 = 4;
  }
  len = count_encoded_length(idx + 1,local_60);
  if (len < 0x11) {
    prefixlen._0_1_ = pack_first_byte(indexing_mode);
    encode_length((uint8_t *)&prefixlen,idx + 1,local_60);
    bufs_local._4_4_ = nghttp2_bufs_add(bufs,&prefixlen,len);
    if ((bufs_local._4_4_ == 0) &&
       (bufs_local._4_4_ = emit_string(bufs,nv->value,nv->valuelen), bufs_local._4_4_ == 0)) {
      bufs_local._4_4_ = 0;
    }
  }
  else {
    bufs_local._4_4_ = -0x20b;
  }
  return bufs_local._4_4_;
}

Assistant:

static int emit_indname_block(nghttp2_bufs *bufs, size_t idx,
                              const nghttp2_nv *nv, int indexing_mode) {
  int rv;
  uint8_t *bufp;
  size_t blocklen;
  uint8_t sb[16];
  size_t prefixlen;

  if (indexing_mode == NGHTTP2_HD_WITH_INDEXING) {
    prefixlen = 6;
  } else {
    prefixlen = 4;
  }

  DEBUGF("deflatehd: emit indname index=%zu, valuelen=%zu, indexing_mode=%d\n",
         idx, nv->valuelen, indexing_mode);

  blocklen = count_encoded_length(idx + 1, prefixlen);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;

  *bufp = pack_first_byte(indexing_mode);

  encode_length(bufp, idx + 1, prefixlen);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  rv = emit_string(bufs, nv->value, nv->valuelen);
  if (rv != 0) {
    return rv;
  }

  return 0;
}